

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.c
# Opt level: O1

int mbedtls_asn1_write_raw_buffer(uchar **p,uchar *start,uchar *buf,size_t size)

{
  uchar *puVar1;
  int iVar2;
  
  puVar1 = *p;
  iVar2 = -0x6c;
  if (size <= (ulong)((long)puVar1 - (long)start) && start <= puVar1) {
    *p = puVar1 + -size;
    memcpy(puVar1 + -size,buf,size);
    iVar2 = (int)size;
  }
  return iVar2;
}

Assistant:

int mbedtls_asn1_write_raw_buffer(unsigned char **p, const unsigned char *start,
                                  const unsigned char *buf, size_t size)
{
    size_t len = 0;

    if (*p < start || (size_t) (*p - start) < size) {
        return MBEDTLS_ERR_ASN1_BUF_TOO_SMALL;
    }

    len = size;
    (*p) -= len;
    memcpy(*p, buf, len);

    return (int) len;
}